

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O1

int __thiscall
jrtplib::RTPSources::ObtainSourceDataInstance
          (RTPSources *this,uint32_t ssrc,RTPInternalSourceData **srcdat,bool *created)

{
  RTPMemoryManager *pRVar1;
  _func_int **pp_Var2;
  RTPInternalSourceData *this_00;
  HashElement *pHVar3;
  HashElement *pHVar4;
  int index;
  uint uVar5;
  int iVar6;
  bool bVar7;
  bool bVar8;
  
  uVar5 = ssrc % 0x207d;
  pHVar3 = (this->sourcelist).table[uVar5];
  (this->sourcelist).curhashelem = pHVar3;
  bVar8 = false;
  do {
    pHVar4 = pHVar3;
    if (pHVar4 == (HashElement *)0x0) goto LAB_0011cc4e;
    pHVar3 = pHVar4;
    bVar7 = true;
    if (pHVar4->key != ssrc) {
      pHVar3 = pHVar4->hashnext;
      (this->sourcelist).curhashelem = pHVar3;
      bVar7 = bVar8;
    }
    bVar8 = bVar7;
  } while (!bVar7);
  if (pHVar4 != (HashElement *)0x0) {
    *srcdat = ((this->sourcelist).curhashelem)->element;
    *created = false;
    return 0;
  }
LAB_0011cc4e:
  pRVar1 = (this->super_RTPMemoryObject).mgr;
  if (pRVar1 == (RTPMemoryManager *)0x0) {
    this_00 = (RTPInternalSourceData *)operator_new(0x280);
  }
  else {
    this_00 = (RTPInternalSourceData *)(**(code **)(*(long *)pRVar1 + 0x10))(pRVar1,0x280,0x18);
  }
  RTPInternalSourceData::RTPInternalSourceData
            (this_00,ssrc,this->probationtype,(this->super_RTPMemoryObject).mgr);
  pHVar3 = (this->sourcelist).table[uVar5];
  if (pHVar3 != (HashElement *)0x0) {
    bVar8 = false;
    do {
      if (pHVar3->key == ssrc) {
        bVar8 = true;
      }
      else {
        pHVar3 = pHVar3->hashnext;
      }
    } while ((!bVar8) && (pHVar3 != (HashElement *)0x0));
    if (bVar8) {
      iVar6 = -9;
      bVar8 = true;
      goto LAB_0011cd50;
    }
  }
  pRVar1 = (this->sourcelist).super_RTPMemoryObject.mgr;
  if (pRVar1 == (RTPMemoryManager *)0x0) {
    pHVar3 = (HashElement *)operator_new(0x30);
  }
  else {
    pHVar3 = (HashElement *)
             (**(code **)(*(long *)pRVar1 + 0x10))(pRVar1,0x30,(this->sourcelist).memorytype);
  }
  pHVar3->key = ssrc;
  pHVar3->element = this_00;
  pHVar3->hashprev = (HashElement *)0x0;
  pHVar3->hashnext = (HashElement *)0x0;
  pHVar3->listprev = (HashElement *)0x0;
  pHVar3->listnext = (HashElement *)0x0;
  pHVar3->hashindex = uVar5;
  pHVar4 = (this->sourcelist).table[uVar5];
  (this->sourcelist).table[uVar5] = pHVar3;
  pHVar3->hashnext = pHVar4;
  if (pHVar4 != (HashElement *)0x0) {
    pHVar4->hashprev = pHVar3;
  }
  if ((this->sourcelist).firsthashelem == (HashElement *)0x0) {
    (this->sourcelist).firsthashelem = pHVar3;
  }
  else {
    pHVar4 = (this->sourcelist).lasthashelem;
    pHVar4->listnext = pHVar3;
    pHVar3->listprev = pHVar4;
  }
  (this->sourcelist).lasthashelem = pHVar3;
  bVar8 = false;
  iVar6 = 0;
LAB_0011cd50:
  if (!bVar8) {
    *srcdat = this_00;
    *created = true;
    this->totalcount = this->totalcount + 1;
    return 0;
  }
  pRVar1 = (this->super_RTPMemoryObject).mgr;
  pp_Var2 = (this_00->super_RTPSourceData).super_RTPMemoryObject._vptr_RTPMemoryObject;
  if (pRVar1 == (RTPMemoryManager *)0x0) {
    (*pp_Var2[1])(this_00);
    return iVar6;
  }
  (**pp_Var2)(this_00);
  (**(code **)(*(long *)pRVar1 + 0x18))(pRVar1,this_00);
  return iVar6;
}

Assistant:

int RTPSources::ObtainSourceDataInstance(uint32_t ssrc,RTPInternalSourceData **srcdat,bool *created)
{
	RTPInternalSourceData *srcdat2;
	int status;
	
	if (sourcelist.GotoElement(ssrc) < 0) // No entry for this source
	{
#ifdef RTP_SUPPORT_PROBATION
		srcdat2 = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPINTERNALSOURCEDATA) RTPInternalSourceData(ssrc,probationtype,GetMemoryManager());
#else
		srcdat2 = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPINTERNALSOURCEDATA) RTPInternalSourceData(ssrc,RTPSources::NoProbation,GetMemoryManager());
#endif // RTP_SUPPORT_PROBATION
		if (srcdat2 == 0)
			return ERR_RTP_OUTOFMEM;
		if ((status = sourcelist.AddElement(ssrc,srcdat2)) < 0)
		{
			RTPDelete(srcdat2,GetMemoryManager());
			return status;
		}
		*srcdat = srcdat2;
		*created = true;
		totalcount++;
	}
	else
	{
		*srcdat = sourcelist.GetCurrentElement();
		*created = false;
	}
	return 0;
}